

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_tick(t_sigmund *x)

{
  int iVar1;
  t_sigmund *x_local;
  
  if (x->x_infill == x->x_npts) {
    sigmund_doit(x,x->x_npts,x->x_inbuf,x->x_loud,x->x_sr);
    if (x->x_hop < x->x_npts) {
      iVar1 = x->x_npts - x->x_hop;
      x->x_infill = iVar1;
      memmove(x->x_inbuf,x->x_inbuf + x->x_hop,(long)iVar1 << 2);
      x->x_countdown = 0;
    }
    else {
      x->x_infill = 0;
      x->x_countdown = x->x_hop - x->x_npts;
    }
    if (x->x_loud != 0) {
      x->x_loud = x->x_loud + -1;
    }
  }
  return;
}

Assistant:

static void sigmund_tick(t_sigmund *x)
{
    if (x->x_infill == x->x_npts)
    {
        sigmund_doit(x, x->x_npts, x->x_inbuf, x->x_loud, x->x_sr);
        if (x->x_hop >= x->x_npts)
        {
            x->x_infill = 0;
            x->x_countdown = x->x_hop - x->x_npts;
        }
        else
        {
            memmove(x->x_inbuf, x->x_inbuf + x->x_hop,
                (x->x_infill = x->x_npts - x->x_hop) * sizeof(*x->x_inbuf));
            x->x_countdown = 0;
        }
        if (x->x_loud)
            x->x_loud--;
    }
}